

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O0

int dict2pid_add_word(dict2pid_t *d2p,int32 wid)

{
  bin_mdef_t *m;
  dict_t *pdVar1;
  int iVar2;
  s3ssid_t *uncomp_tab;
  s3ssid_t *com_tab;
  s3cipid_t *ci_map;
  char *pcVar3;
  bool bVar4;
  short local_4a;
  int p_1;
  s3cipid_t r;
  s3cipid_t *tmpcimap;
  s3ssid_t *tmpssid;
  s3ssid_t *rmap;
  int p;
  s3cipid_t l;
  dict_t *d;
  bin_mdef_t *mdef;
  int32 wid_local;
  dict2pid_t *d2p_local;
  
  m = d2p->mdef;
  pdVar1 = d2p->dict;
  if (pdVar1->word[wid].pronlen < 2) {
    pcVar3 = bin_mdef_ciphone_str(m,(int)*pdVar1->word[wid].ciphone);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict2pid.c"
            ,0x168,"Filling in context triphones for %s(?,?)\n",pcVar3);
    if (**d2p->lrdiph_rc[*pdVar1->word[wid].ciphone] == 0xffff) {
      populate_lrdiph(d2p,(s3ssid_t ***)0x0,*pdVar1->word[wid].ciphone);
    }
  }
  else {
    if (*d2p->ldiph_lc[*pdVar1->word[wid].ciphone][pdVar1->word[wid].ciphone[1]] == 0xffff) {
      for (rmap._6_2_ = 0; (int)rmap._6_2_ < m->n_ciphone; rmap._6_2_ = rmap._6_2_ + 1) {
        iVar2 = bin_mdef_phone_id_nearest
                          (m,(int)*pdVar1->word[wid].ciphone,(int)rmap._6_2_,
                           (int)pdVar1->word[wid].ciphone[1],1);
        d2p->ldiph_lc[*pdVar1->word[wid].ciphone][pdVar1->word[wid].ciphone[1]][rmap._6_2_] =
             (s3ssid_t)m->phone[iVar2].ssid;
      }
    }
    if (d2p->rssid[pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -1]]
        [pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -2]].n_ssid == 0) {
      uncomp_tab = (s3ssid_t *)
                   __ckd_calloc__((long)m->n_ciphone,2,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict2pid.c"
                                  ,0x150);
      for (local_4a = 0; (int)local_4a < m->n_ciphone; local_4a = local_4a + 1) {
        iVar2 = bin_mdef_phone_id_nearest
                          (m,(int)pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -1],
                           (int)pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -2],
                           (int)local_4a,2);
        uncomp_tab[local_4a] = (s3ssid_t)m->phone[iVar2].ssid;
      }
      com_tab = (s3ssid_t *)
                __ckd_calloc__((long)m->n_ciphone,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict2pid.c"
                               ,0x159);
      ci_map = (s3cipid_t *)
               __ckd_calloc__((long)m->n_ciphone,2,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict2pid.c"
                              ,0x15a);
      compress_table(uncomp_tab,com_tab,ci_map,m->n_ciphone);
      local_4a = 0;
      while( true ) {
        bVar4 = false;
        if ((int)local_4a < m->n_ciphone) {
          bVar4 = com_tab[local_4a] != 0xffff;
        }
        if (!bVar4) break;
        local_4a = local_4a + 1;
      }
      d2p->rssid[pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -1]]
      [pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -2]].ssid = com_tab;
      d2p->rssid[pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -1]]
      [pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -2]].cimap = ci_map;
      d2p->rssid[pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -1]]
      [pdVar1->word[wid].ciphone[pdVar1->word[wid].pronlen + -2]].n_ssid = (int)local_4a;
      ckd_free(uncomp_tab);
    }
  }
  return 0;
}

Assistant:

int
dict2pid_add_word(dict2pid_t *d2p,
                  int32 wid)
{
    bin_mdef_t *mdef = d2p->mdef;
    dict_t *d = d2p->dict;

    if (dict_pronlen(d, wid) > 1) {
        s3cipid_t l;
        /* Make sure we have left and right context diphones for this
         * word. */
        if (d2p->ldiph_lc[dict_first_phone(d, wid)][dict_second_phone(d, wid)][0]
            == BAD_S3SSID) {
            E_DEBUG("Filling in left-context diphones for %s(?,%s)\n",
                   bin_mdef_ciphone_str(mdef, dict_first_phone(d, wid)),
                   bin_mdef_ciphone_str(mdef, dict_second_phone(d, wid)));
            for (l = 0; l < bin_mdef_n_ciphone(mdef); l++) {
                int p
                    = bin_mdef_phone_id_nearest(mdef,
                                                dict_first_phone(d, wid), l,
                                                dict_second_phone(d, wid),
                                                WORD_POSN_BEGIN);
                d2p->ldiph_lc[dict_first_phone(d, wid)][dict_second_phone(d, wid)][l]
                    = bin_mdef_pid2ssid(mdef, p);
            }
        }
        if (d2p->rssid[dict_last_phone(d, wid)][dict_second_last_phone(d, wid)].n_ssid
            == 0) {
            s3ssid_t *rmap;
            s3ssid_t *tmpssid;
            s3cipid_t *tmpcimap;
            s3cipid_t r;

            E_DEBUG("Filling in right-context diphones for %s(%s,?)\n",
                   bin_mdef_ciphone_str(mdef, dict_last_phone(d, wid)),
                   bin_mdef_ciphone_str(mdef, dict_second_last_phone(d, wid)));
            rmap = ckd_calloc(bin_mdef_n_ciphone(mdef), sizeof(*rmap));
            for (r = 0; r < bin_mdef_n_ciphone(mdef); r++) {
                int p
                    = bin_mdef_phone_id_nearest(mdef,
                                                dict_last_phone(d, wid),
                                                dict_second_last_phone(d, wid), r,
                                                WORD_POSN_END);
                rmap[r] = bin_mdef_pid2ssid(mdef, p);
            }
            tmpssid = ckd_calloc(bin_mdef_n_ciphone(mdef), sizeof(*tmpssid));
            tmpcimap = ckd_calloc(bin_mdef_n_ciphone(mdef), sizeof(*tmpcimap));
            compress_table(rmap, tmpssid, tmpcimap, bin_mdef_n_ciphone(mdef));
            for (r = 0; r < mdef->n_ciphone && tmpssid[r] != BAD_S3SSID; r++)
                ;
            d2p->rssid[dict_last_phone(d, wid)][dict_second_last_phone(d, wid)].ssid = tmpssid;
            d2p->rssid[dict_last_phone(d, wid)][dict_second_last_phone(d, wid)].cimap = tmpcimap;
            d2p->rssid[dict_last_phone(d, wid)][dict_second_last_phone(d, wid)].n_ssid = r;
            ckd_free(rmap);
        }
    }
    else {
        /* Make sure we have a left-right context triphone entry for
         * this word. */
        E_INFO("Filling in context triphones for %s(?,?)\n",
               bin_mdef_ciphone_str(mdef, dict_first_phone(d, wid)));
        if (d2p->lrdiph_rc[dict_first_phone(d, wid)][0][0] == BAD_S3SSID) {
            populate_lrdiph(d2p, NULL, dict_first_phone(d, wid));
        }
    }

    return 0;
}